

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound-core.c
# Opt level: O3

void close_sound(void)

{
  return;
}

Assistant:

void close_sound(void)
{
	if (0 == next_sound_id) return;	/* Never opened */

	/*
	 * Ask the platforms sound module to free resources for each
	 * sound
	 */
	if (hooks.unload_sound_hook) {
		int i;

		for (i = 0; i < next_sound_id; i++) {
			hooks.unload_sound_hook(&sounds[i]);
			string_free(sounds[i].name);
		}
	}

	mem_free(sounds);
	sounds = NULL;
	next_sound_id = 0;

	/* Close the platform's sound module */
	if (hooks.close_audio_hook) {
		hooks.close_audio_hook();
	}
}